

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

size_type __thiscall
google::protobuf::Map<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>
::erase<std::__cxx11::string>
          (Map<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue> *this,
          key_arg<std::__cxx11::basic_string<char>_> *key)

{
  iterator pos;
  iterator it;
  iterator local_28;
  
  InnerMap::find<std::__cxx11::string>(&it.it_,(InnerMap *)this,key);
  if (it.it_.node_ != (Node *)0x0) {
    pos.it_.m_ = it.it_.m_;
    pos.it_.node_ = it.it_.node_;
    pos.it_.bucket_index_ = it.it_.bucket_index_;
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
    ::erase(&local_28,
            (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
             *)this,pos);
  }
  return (ulong)(it.it_.node_ != (Node *)0x0);
}

Assistant:

size_type erase(const key_arg<K>& key) {
    iterator it = find(key);
    if (it == end()) {
      return 0;
    } else {
      erase(it);
      return 1;
    }
  }